

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O0

bool __thiscall
WorkQueue<CGL::WorkItem>::try_get_work(WorkQueue<CGL::WorkItem> *this,WorkItem *outPtr)

{
  int iVar1;
  reference pvVar2;
  const_iterator in_RSI;
  vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_> *in_RDI;
  mutex *in_stack_ffffffffffffffd0;
  vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_> *in_stack_ffffffffffffffe0;
  bool local_1;
  
  std::mutex::lock(in_stack_ffffffffffffffd0);
  local_1 = std::vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>::empty
                      (in_stack_ffffffffffffffe0);
  if (local_1) {
    std::mutex::unlock((mutex *)0x1547ec);
  }
  else {
    pvVar2 = std::vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>::front
                       ((vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_> *)
                        in_stack_ffffffffffffffd0);
    iVar1 = pvVar2->tile_y;
    (in_RSI._M_current)->tile_x = pvVar2->tile_x;
    (in_RSI._M_current)->tile_y = iVar1;
    iVar1 = pvVar2->tile_h;
    (in_RSI._M_current)->tile_w = pvVar2->tile_w;
    (in_RSI._M_current)->tile_h = iVar1;
    std::vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>::begin(in_RDI);
    __gnu_cxx::
    __normal_iterator<CGL::WorkItem_const*,std::vector<CGL::WorkItem,std::allocator<CGL::WorkItem>>>
    ::__normal_iterator<CGL::WorkItem*>
              ((__normal_iterator<const_CGL::WorkItem_*,_std::vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>_>
                *)in_stack_ffffffffffffffd0,
               (__normal_iterator<CGL::WorkItem_*,_std::vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>_>
                *)in_RDI);
    std::vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>::erase
              (in_stack_ffffffffffffffe0,in_RSI);
    std::mutex::unlock((mutex *)0x15484f);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool try_get_work(T *outPtr) {
    lock.lock();
    if (storage.empty()) {
      lock.unlock();
      return false;
    }
    *outPtr = storage.front();
    storage.erase(storage.begin());
    lock.unlock();
    return true;
  }